

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLineCam::ChLineCam(ChLineCam *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineCam_00b66118;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->center).m_data[0] = 0.0;
  (this->center).m_data[1] = 0.0;
  (this->center).m_data[2] = 0.0;
  *(undefined8 *)&(this->super_ChLine).complexityU = 10;
  (this->super_ChLine).closed = true;
  this->Rb = 1.0;
  this->Rr = 0.0;
  this->p = 1.8;
  this->d = 2.0;
  this->b0 = 0.5235987755982988;
  if (this != (ChLineCam *)(Q_ROTATE_Z_TO_X + 0x18)) {
    (this->center).m_data[0] = VNULL;
    (this->center).m_data[1] = DAT_00b90ac0;
    (this->center).m_data[2] = DAT_00b90ac8;
  }
  this->e = 0.0;
  this->s = 1.0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->negative = false;
  this->internal = false;
  return;
}

Assistant:

ChLineCam::ChLineCam() {
    Set_complexity(10);
    this->closed = true;
    type = CAM_TYPE_SLIDEFOLLOWER;
    Rb = 1.0;
    Rr = 0.0;
    p = 1.8;
    d = 2;
    b0 = CH_C_PI / 6.0;
    center = VNULL;
    e = 0;
    s = Rb;
    law = chrono_types::make_shared<ChFunction_Const>(0);  // default law = no follower motion
    negative = false;
    internal = false;
}